

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-spell.c
# Opt level: O0

void spell_menu_browser(wchar_t oid,void *data,region_conflict *loc)

{
  wchar_t index;
  _Bool _Var1;
  uint uVar2;
  class_spell_conflict *pcVar3;
  char *__s;
  size_t sVar4;
  char *projection;
  effect *e_1;
  dice_t *pdStack_50;
  wchar_t i;
  dice_t *shared_dice;
  effect *e;
  wchar_t num_damaging;
  class_spell_conflict *spell;
  wchar_t spell_index;
  spell_menu_data *d;
  region_conflict *loc_local;
  void *data_local;
  wchar_t oid_local;
  
  index = *(wchar_t *)(*data + (long)oid * 4);
  pcVar3 = spell_by_index(player,index);
  if ((*(byte *)((long)data + 0x18) & 1) != 0) {
    text_out_hook = text_out_to_screen;
    text_out_wrap = L'\0';
    text_out_indent = loc->col + L'\xffffffff';
    text_out_pad = L'\x01';
    Term_gotoxy(loc->col,loc->row + loc->page_rows);
    text_out("\n%s",pcVar3->text);
    e._4_4_ = 0;
    for (shared_dice = (dice_t *)pcVar3->effect; shared_dice != (dice_t *)0x0;
        shared_dice = (dice_t *)effect_next((effect *)shared_dice)) {
      _Var1 = effect_damages((effect *)shared_dice);
      if (_Var1) {
        e._4_4_ = e._4_4_ + 1;
      }
    }
    if (((0 < e._4_4_) && ((player->spell_flags[index] & 2) != 0)) &&
       ((player->spell_flags[index] & 4) == 0)) {
      pdStack_50 = (dice_t *)0x0;
      e_1._4_4_ = 0;
      text_out("  Inflicts an average of");
      for (projection = (char *)pcVar3->effect; projection != (char *)0x0;
          projection = (char *)effect_next((effect *)projection)) {
        if (*(short *)(projection + 8) == 0x7b) {
          pdStack_50 = *(dice_t **)(projection + 0x10);
        }
        else if (*(short *)(projection + 8) == 0x7c) {
          pdStack_50 = (dice_t *)0x0;
        }
        _Var1 = effect_damages((effect *)projection);
        if (_Var1) {
          if ((2 < e._4_4_) && (0 < e_1._4_4_)) {
            text_out(",");
          }
          if ((1 < e._4_4_) && (e_1._4_4_ == e._4_4_ + -1)) {
            text_out(" and");
          }
          uVar2 = effect_avg_damage((effect *)projection,pdStack_50);
          text_out_c('\r'," %d",(ulong)uVar2);
          __s = effect_projection((effect *)projection);
          sVar4 = strlen(__s);
          if (sVar4 != 0) {
            text_out(" %s",__s);
          }
          e_1._4_4_ = e_1._4_4_ + 1;
        }
      }
      text_out(" damage.");
    }
    text_out("\n\n");
    text_out_pad = L'\0';
    text_out_indent = L'\0';
  }
  return;
}

Assistant:

static void spell_menu_browser(int oid, void *data, const region *loc)
{
	struct spell_menu_data *d = data;
	int spell_index = d->spells[oid];
	const struct class_spell *spell = spell_by_index(player, spell_index);

	if (d->show_description) {
		/* Redirect output to the screen */
		text_out_hook = text_out_to_screen;
		text_out_wrap = 0;
		text_out_indent = loc->col - 1;
		text_out_pad = 1;

		Term_gotoxy(loc->col, loc->row + loc->page_rows);
		/* Spell description */
		text_out("\n%s", spell->text);

		/* To summarize average damage, count the damaging effects */
		int num_damaging = 0;
		for (struct effect *e = spell->effect; e != NULL; e = effect_next(e)) {
			if (effect_damages(e)) {
				num_damaging++;
			}
		}
		/* Now enumerate the effects' damage and type if not forgotten */
		if (num_damaging > 0
			&& (player->spell_flags[spell_index] & PY_SPELL_WORKED)
			&& !(player->spell_flags[spell_index] & PY_SPELL_FORGOTTEN)) {
			dice_t *shared_dice = NULL;
			int i = 0;

			text_out("  Inflicts an average of");
			for (struct effect *e = spell->effect; e != NULL; e = effect_next(e)) {
				if (e->index == EF_SET_VALUE) {
					shared_dice = e->dice;
				} else if (e->index == EF_CLEAR_VALUE) {
					shared_dice = NULL;
				}
				if (effect_damages(e)) {
					if (num_damaging > 2 && i > 0) {
						text_out(",");
					}
					if (num_damaging > 1 && i == num_damaging - 1) {
						text_out(" and");
					}
					text_out_c(COLOUR_L_GREEN, " %d", effect_avg_damage(e, shared_dice));
					const char *projection = effect_projection(e);
					if (strlen(projection) > 0) {
						text_out(" %s", projection);
					}
					i++;
				}
			}
			text_out(" damage.");
		}
		text_out("\n\n");

		/* XXX */
		text_out_pad = 0;
		text_out_indent = 0;
	}
}